

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::CanInitializeByZeroing
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  FieldDescriptor FVar1;
  uint uVar2;
  string_view name;
  long lVar3;
  bool bVar4;
  byte bVar5;
  Descriptor *descriptor;
  ulong uVar6;
  byte bVar7;
  undefined1 *puVar8;
  char *pcVar9;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  string sStack_e0;
  AlphaNum AStack_c0;
  AlphaNum AStack_90;
  
  FVar1 = field[1];
  bVar4 = (bool)(((byte)FVar1 & 0x20) >> 5);
  if (0xbf < (byte)FVar1 != bVar4) {
    uVar6 = (ulong)bVar4;
    CanInitializeByZeroing();
    bVar7 = *(byte *)(uVar6 + 1);
    bVar4 = (bool)((bVar7 & 0x20) >> 5);
    if (0xbf < bVar7 != bVar4) {
      uVar6 = (ulong)bVar4;
      CanClearByZeroing();
      bVar7 = *(byte *)(uVar6 + 1);
      bVar5 = (bVar7 & 0x20) >> 5;
      if (0xbf < bVar7 != (bool)bVar5) {
        uVar6 = (ulong)(0xbf < bVar7);
        HasTrivialSwap();
        pcVar9 = (char *)0x0;
        uStack_f0 = 0;
        puVar8 = &uStack_f0;
        if (*(cpp **)(uVar6 + 0x18) != (cpp *)0x0) {
          ClassName_abi_cxx11_(&sStack_e0,*(cpp **)(uVar6 + 0x18),descriptor);
          AStack_c0.piece_._M_len = sStack_e0._M_string_length;
          AStack_c0.piece_._M_str = sStack_e0._M_dataplus._M_p;
          AStack_90.piece_._M_len = 1;
          AStack_90.piece_._M_str = "_";
          absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0,&AStack_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
            operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
          }
        }
        AStack_c0.piece_._M_str = (char *)**(undefined8 **)(uVar6 + 8);
        AStack_c0.piece_._M_len = (*(undefined8 **)(uVar6 + 8))[1];
        absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0);
        if (*(char *)(*(long *)(uVar6 + 0x20) + 0x53) == '\x01') {
          AStack_c0.piece_._M_len = 9;
          AStack_c0.piece_._M_str = "_DoNotUse";
          absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0);
        }
        name._M_str = pcVar9;
        name._M_len = (size_t)puVar8;
        ResolveKeyword_abi_cxx11_(name);
        if (puVar8 != &uStack_f0) {
          operator_delete(puVar8,CONCAT71(uStack_ef,uStack_f0) + 1);
        }
        return (bool)bVar5;
      }
      if (((bVar7 & 0x28) == 0) &&
         (uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)*(byte *)(uVar6 + 2) * 4), uVar2 < 0xb)) {
        bVar7 = (byte)(0x5fe >> ((byte)uVar2 & 0x1f));
      }
      else {
        bVar7 = 0;
      }
      return (bool)(bVar7 & 1);
    }
    if ((bVar7 & 0x28) != 0) {
LAB_001e0ffc:
      return false;
    }
    switch(*(undefined4 *)
            ((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(uVar6 + 2) * 4)) {
    case 1:
    case 3:
      bVar7 = *(int *)(uVar6 + 0x50) == 0;
      break;
    case 2:
    case 4:
      bVar7 = *(long *)(uVar6 + 0x50) == 0;
      break;
    case 5:
      bVar4 = *(double *)(uVar6 + 0x50) == 0.0;
      goto LAB_001e0ff2;
    case 6:
      bVar4 = *(float *)(uVar6 + 0x50) == 0.0;
LAB_001e0ff2:
      bVar7 = -bVar4 & 1;
      break;
    case 7:
      bVar7 = *(byte *)(uVar6 + 0x50) ^ 1;
      break;
    case 8:
      lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
      bVar7 = *(int *)(lVar3 + 4) == 0;
      break;
    default:
      goto LAB_001e0ffc;
    }
    return (bool)bVar7;
  }
  if (((byte)FVar1 & 0x28) != 0) {
LAB_001e0f5a:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar7 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar7 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar4 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001e0f53;
  case 6:
    bVar4 = *(float *)(field + 0x50) == 0.0;
LAB_001e0f53:
    bVar7 = -bVar4 & 1;
    break;
  case 7:
    bVar7 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar7 = *(int *)(lVar3 + 4) == 0;
    break;
  default:
    goto LAB_001e0f5a;
  case 10:
    bVar7 = 1;
  }
  return (bool)bVar7;
}

Assistant:

bool CanInitializeByZeroing(const FieldDescriptor* field,
                            const Options& options,
                            MessageSCCAnalyzer* scc_analyzer) {
  static_assert(
      std::numeric_limits<float>::is_iec559 &&
          std::numeric_limits<double>::is_iec559,
      "proto / abseil requires iec559, which has zero initialized floats.");

  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
    default:
      return false;
  }
}